

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

void VulkanUtilities::SetObjectName
               (VkDevice device,uint64_t objectHandle,VkObjectType objectType,char *name)

{
  int iVar1;
  string msg;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  uint64_t local_20;
  char *local_18;
  
  if ((name != (char *)0x0 && (anonymous_namespace)::SetDebugUtilsObjectNameEXT != (code *)0x0) &&
     (*name != '\0')) {
    uStack_30 = 0;
    local_38 = 0x3b9cbe00;
    local_28 = (ulong)objectType;
    local_20 = objectHandle;
    local_18 = name;
    iVar1 = (*(anonymous_namespace)::SetDebugUtilsObjectNameEXT)(device,&local_38);
    if (iVar1 != 0) {
      Diligent::FormatString<char[26],char[18]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"res == VK_SUCCESS",(char (*) [18])name);
      Diligent::DebugAssertionFailed
                (local_58._M_dataplus._M_p,"SetObjectName",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0x152);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return;
}

Assistant:

void SetObjectName(VkDevice device, uint64_t objectHandle, VkObjectType objectType, const char* name)
{
    // Check for valid function pointer (may not be present if not running in a debug mode)
    if (SetDebugUtilsObjectNameEXT == nullptr || name == nullptr || name[0] == '\0')
        return;

    VkDebugUtilsObjectNameInfoEXT ObjectNameInfo{};
    ObjectNameInfo.sType        = VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_NAME_INFO_EXT;
    ObjectNameInfo.pNext        = nullptr;
    ObjectNameInfo.objectType   = objectType;
    ObjectNameInfo.objectHandle = objectHandle;
    ObjectNameInfo.pObjectName  = name;

    VkResult res = SetDebugUtilsObjectNameEXT(device, &ObjectNameInfo);
    VERIFY_EXPR(res == VK_SUCCESS);
    (void)res;
}